

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall CTextRender::TextAdvance(CTextRender *this,CTextCursor *pCursor,float AdvanceX)

{
  int iVar1;
  int iVar2;
  IGraphics *pIVar3;
  long in_RSI;
  CTextRender *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float MaxWidth;
  int LineWidth;
  int ScreenHeight;
  int ScreenWidth;
  vec2 ScreenScale;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  float local_44;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_20 [2];
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar3 = Graphics(in_RDI);
  iVar1 = IGraphics::ScreenWidth(pIVar3);
  pIVar3 = Graphics(in_RDI);
  iVar2 = IGraphics::ScreenHeight(pIVar3);
  pIVar3 = Graphics(in_RDI);
  (*(pIVar3->super_IInterface)._vptr_IInterface[6])(pIVar3,&local_c,&local_10,&local_14,&local_18);
  vector2_base<float>::vector2_base
            ((vector2_base<float> *)local_20,(float)iVar1 / (local_14 - local_c),
             (float)iVar2 / (local_18 - local_10));
  iVar1 = (int)(*(float *)(in_RSI + 0x20) + in_XMM0_Da);
  local_44 = *(float *)(in_RSI + 0x50);
  if (local_44 < 0.0) {
    local_44 = INFINITY;
  }
  if ((float)iVar1 <= local_44) {
    *(float *)(in_RSI + 0x20) = (float)iVar1;
  }
  else {
    (*(in_RDI->super_IEngineTextRender).super_ITextRender.super_IInterface._vptr_IInterface[8])
              (in_RDI,in_RSI);
    *(float *)(in_RSI + 0x20) = (float)iVar1 - local_44;
  }
  *(float *)(in_RSI + 0x20) =
       (float)(int)(*(float *)(in_RSI + 0x20) * local_20[0].x) / local_20[0].x;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTextRender::TextAdvance(CTextCursor *pCursor, float AdvanceX)
{
	// Alignment
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));

	int LineWidth = pCursor->m_Advance.x + AdvanceX;
	float MaxWidth = pCursor->m_MaxWidth;
	if(MaxWidth < 0)
		MaxWidth = INFINITY;
	if(LineWidth > MaxWidth)
	{
		TextNewline(pCursor);
		pCursor->m_Advance.x = LineWidth - MaxWidth;
	}
	else
	{
		pCursor->m_Advance.x = LineWidth;
	}

	pCursor->m_Advance.x = (int)(pCursor->m_Advance.x * ScreenScale.x) / ScreenScale.x;
}